

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_macro_function.cpp
# Opt level: O1

unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> __thiscall
duckdb::ScalarMacroFunction::Deserialize(ScalarMacroFunction *this,Deserializer *deserializer)

{
  int iVar1;
  _Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false> this_00;
  pointer pSVar2;
  pointer *__ptr;
  byte bVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
  result;
  _Tuple_impl<0UL,_duckdb::ScalarMacroFunction_*,_std::default_delete<duckdb::ScalarMacroFunction>_>
  local_38;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_30;
  
  this_00._M_head_impl = (ScalarMacroFunction *)operator_new(0x68);
  ScalarMacroFunction(this_00._M_head_impl);
  local_38.super__Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>)
       (_Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>)this_00._M_head_impl;
  pSVar2 = unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
           ::operator->((unique_ptr<duckdb::ScalarMacroFunction,_std::default_delete<duckdb::ScalarMacroFunction>,_true>
                         *)&local_38);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"expression");
  bVar3 = (byte)iVar1;
  if (bVar3 == 0) {
    _Var4._M_head_impl =
         (pSVar2->expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar2->expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if (_Var4._M_head_impl == (ParsedExpression *)0x0) {
      bVar3 = 0;
      goto LAB_005c58cc;
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_30._M_head_impl = (ParsedExpression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      ParsedExpression::Deserialize((ParsedExpression *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var4._M_head_impl =
         (pSVar2->expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar2->expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var4._M_head_impl == (ParsedExpression *)0x0) {
      bVar3 = 1;
      goto LAB_005c58cc;
    }
  }
  (*((_Var4._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
LAB_005c58cc:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar3);
  (this->super_MacroFunction)._vptr_MacroFunction =
       (_func_int **)
       local_38.super__Head_base<0UL,_duckdb::ScalarMacroFunction_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>_>)
         (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>_>)this;
}

Assistant:

unique_ptr<MacroFunction> ScalarMacroFunction::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ScalarMacroFunction>(new ScalarMacroFunction());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "expression", result->expression);
	return std::move(result);
}